

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall sensors_analytics::DefaultConsumer::Close(DefaultConsumer *this)

{
  HttpSender *this_00;
  LockGuard local_18;
  LockGuard records_lock;
  DefaultConsumer *this_local;
  
  records_lock.mutex_ = (pthread_mutex_t *)this;
  LockGuard::LockGuard(&local_18,&this->records_mutex_);
  LoadRecordFromDisk(this);
  DumpRecordToDisk(this);
  if (this->sender_ != (HttpSender *)0x0) {
    this_00 = this->sender_;
    if (this_00 != (HttpSender *)0x0) {
      HttpSender::~HttpSender(this_00);
      operator_delete(this_00);
    }
    this->sender_ = (HttpSender *)0x0;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->sending_mutex_);
  pthread_mutex_destroy((pthread_mutex_t *)&this->records_mutex_);
  LockGuard::~LockGuard(&local_18);
  return;
}

Assistant:

void DefaultConsumer::Close() {
  LockGuard records_lock(&records_mutex_);
  LoadRecordFromDisk();
  DumpRecordToDisk();
  if (sender_ != NULL) {
    delete sender_;
    sender_ = NULL;
  }
  SA_MUTEX_DESTROY(&sending_mutex_);
  SA_MUTEX_DESTROY(&records_mutex_);
}